

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O0

void ur_kinematics::forward(double *q,double *T)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double c234;
  double s234;
  double c23;
  double s23;
  double c6;
  double s6;
  double c5;
  double s5;
  double c4;
  double s4;
  double c3;
  double s3;
  double c2;
  double s2;
  double q234;
  double q23;
  double c1;
  double s1;
  double *T_local;
  double *q_local;
  
  dVar2 = sin(*q);
  dVar3 = cos(*q);
  pdVar1 = q + 1;
  dVar14 = *pdVar1;
  dVar8 = *pdVar1;
  dVar4 = sin(*pdVar1);
  dVar5 = cos(*pdVar1);
  pdVar1 = q + 2;
  sin(*pdVar1);
  cos(*pdVar1);
  dVar15 = *pdVar1;
  dVar9 = *pdVar1;
  pdVar1 = q + 3;
  dVar6 = sin(*pdVar1);
  dVar7 = cos(*pdVar1);
  dVar8 = *pdVar1 + dVar9 + dVar8;
  dVar9 = sin(q[4]);
  dVar10 = cos(q[4]);
  dVar11 = sin(q[5]);
  dVar12 = cos(q[5]);
  dVar13 = sin(dVar15 + dVar14);
  dVar14 = cos(dVar15 + dVar14);
  dVar15 = sin(dVar8);
  dVar8 = cos(dVar8);
  *T = dVar8 * dVar3 * dVar9 + -(dVar10 * dVar2);
  T[1] = dVar12 * (dVar2 * dVar9 + dVar8 * dVar3 * dVar10) + -(dVar15 * dVar3 * dVar11);
  T[2] = -dVar11 * (dVar2 * dVar9 + dVar8 * dVar3 * dVar10) + -(dVar15 * dVar3 * dVar12);
  T[3] = dVar2 * -0.1333 +
         -(dVar15 * 0.0997) * dVar3 +
         -(dVar10 * 0.0996) * dVar2 +
         -(dVar3 * -0.425) * dVar5 + dVar8 * 0.0996 * dVar3 * dVar9 + -(dVar14 * -0.3922 * dVar3);
  T[4] = dVar3 * dVar10 + dVar8 * dVar2 * dVar9;
  T[5] = -dVar12 * (dVar3 * dVar9 + -(dVar8 * dVar10 * dVar2)) + -(dVar15 * dVar2 * dVar11);
  T[6] = dVar11 * (dVar3 * dVar9 + -(dVar8 * dVar10 * dVar2)) + -(dVar15 * dVar12 * dVar2);
  T[7] = -(dVar15 * 0.0997) * dVar2 +
         -(dVar5 * -0.425) * dVar2 +
         -(dVar14 * -0.3922) * dVar2 +
         (dVar3 * dVar10 + dVar8 * dVar2 * dVar9) * 0.0996 + dVar3 * 0.1333;
  T[8] = -dVar15 * dVar9;
  T[9] = -dVar8 * dVar11 + -(dVar15 * dVar10 * dVar12);
  T[10] = dVar15 * dVar10 * dVar11 + -(dVar8 * dVar12);
  T[0xb] = -(dVar9 * 0.0996) * (dVar14 * dVar6 + dVar13 * dVar7) +
           (dVar14 * dVar7 + -(dVar13 * dVar6)) * -0.0997 +
           dVar4 * -0.425 + dVar13 * -0.3922 + 0.1625;
  T[0xc] = 0.0;
  T[0xd] = 0.0;
  T[0xe] = 0.0;
  T[0xf] = 1.0;
  return;
}

Assistant:

void forward(const double* q, double* T) {
    double s1 = sin(*q), c1 = cos(*q); q++;
    double q23 = *q, q234 = *q, s2 = sin(*q), c2 = cos(*q); q++;
    double s3 = sin(*q), c3 = cos(*q); q23 += *q; q234 += *q; q++;
    double s4 = sin(*q), c4 = cos(*q); q234 += *q; q++;
    double s5 = sin(*q), c5 = cos(*q); q++;
    double s6 = sin(*q), c6 = cos(*q);
    double s23 = sin(q23), c23 = cos(q23);
    double s234 = sin(q234), c234 = cos(q234);
    *T = c234*c1*s5 - c5*s1; T++;
    *T = c6*(s1*s5 + c234*c1*c5) - s234*c1*s6; T++;
    *T = -s6*(s1*s5 + c234*c1*c5) - s234*c1*c6; T++;
    *T = d6*c234*c1*s5 - a3*c23*c1 - a2*c1*c2 - d6*c5*s1 - d5*s234*c1 - d4*s1; T++;
    *T = c1*c5 + c234*s1*s5; T++;
    *T = -c6*(c1*s5 - c234*c5*s1) - s234*s1*s6; T++;
    *T = s6*(c1*s5 - c234*c5*s1) - s234*c6*s1; T++;
    *T = d6*(c1*c5 + c234*s1*s5) + d4*c1 - a3*c23*s1 - a2*c2*s1 - d5*s234*s1; T++;
    *T = -s234*s5; T++;
    *T = -c234*s6 - s234*c5*c6; T++;
    *T = s234*c5*s6 - c234*c6; T++;
    *T = d1 + a3*s23 + a2*s2 - d5*(c23*c4 - s23*s4) - d6*s5*(c23*s4 + s23*c4); T++;
    *T = 0.0; T++; *T = 0.0; T++; *T = 0.0; T++; *T = 1.0;
  }